

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_AddAllocatedMessage_Test::TestBody
          (GeneratedMessageReflectionTest_AddAllocatedMessage_Test *this)

{
  Reflection *this_00;
  bool bVar1;
  TestAllTypes_NestedMessage *pTVar2;
  FieldDescriptor *field;
  char *pcVar3;
  AssertHelper local_3e8;
  Message local_3e0;
  int32_t local_3d8;
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_1;
  Message local_3b8;
  int local_3b0 [2];
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar;
  string local_390;
  TestAllTypes_NestedMessage *local_370;
  NestedMessage *nested;
  Reflection *local_358;
  Reflection *reflection;
  TestAllTypes message;
  GeneratedMessageReflectionTest_AddAllocatedMessage_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&reflection);
  local_358 = proto2_unittest::TestAllTypes::GetReflection();
  pTVar2 = (TestAllTypes_NestedMessage *)operator_new(0x20);
  proto2_unittest::TestAllTypes_NestedMessage::TestAllTypes_NestedMessage(pTVar2);
  local_370 = pTVar2;
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0xb);
  this_00 = local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"repeated_nested_message",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  field = F(&local_390);
  Reflection::AddAllocatedMessage(this_00,(Message *)&reflection,field,&local_370->super_Message);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_3b0[1] = 1;
  local_3b0[0] = proto2_unittest::TestAllTypes::repeated_nested_message_size
                           ((TestAllTypes *)&reflection);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3a8,"1","message.repeated_nested_message_size()",local_3b0 + 1,
             local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x43a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  local_3d4 = 0xb;
  pTVar2 = proto2_unittest::TestAllTypes::repeated_nested_message((TestAllTypes *)&reflection,0);
  local_3d8 = proto2_unittest::TestAllTypes_NestedMessage::bb(pTVar2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3d0,"11","message.repeated_nested_message(0).bb()",&local_3d4,
             &local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0x43b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&reflection);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, AddAllocatedMessage) {
  unittest::TestAllTypes message;

  const Reflection* reflection = message.GetReflection();

  unittest::TestAllTypes::NestedMessage* nested =
      new unittest::TestAllTypes::NestedMessage();
  nested->set_bb(11);
  reflection->AddAllocatedMessage(&message, F("repeated_nested_message"),
                                  nested);
  EXPECT_EQ(1, message.repeated_nested_message_size());
  EXPECT_EQ(11, message.repeated_nested_message(0).bb());
}